

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

Maybe<capnp::schema::Value::Reader> * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::annotationValue<capnp::schema::Node::Reader>
          (Maybe<capnp::schema::Value::Reader> *__return_storage_ptr__,CapnpcCppMain *this,
          Reader proto,uint64_t annotationId)

{
  uint *__return_storage_ptr___00;
  bool bVar1;
  uint64_t uVar2;
  Iterator IVar3;
  Reader local_f8;
  undefined1 local_c8 [8];
  Reader annotation;
  undefined1 local_88 [8];
  Iterator __end0;
  undefined1 local_68 [8];
  Iterator __begin0;
  Reader *__range3;
  uint64_t annotationId_local;
  CapnpcCppMain *this_local;
  
  __return_storage_ptr___00 = &__begin0.index;
  capnp::schema::Node::Reader::getAnnotations((Reader *)__return_storage_ptr___00,&proto);
  IVar3 = List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader::begin
                    ((Reader *)__return_storage_ptr___00);
  __end0._8_8_ = IVar3.container;
  __begin0.container._0_4_ = IVar3.index;
  local_68 = (undefined1  [8])__end0._8_8_;
  IVar3 = List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader::end
                    ((Reader *)__return_storage_ptr___00);
  annotation._reader._40_8_ = IVar3.container;
  __end0.container._0_4_ = IVar3.index;
  local_88 = (undefined1  [8])annotation._reader._40_8_;
  while( true ) {
    bVar1 = _::
            IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
            ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                          *)local_68,
                         (IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                          *)local_88);
    if (!bVar1) {
      kj::Maybe<capnp::schema::Value::Reader>::Maybe(__return_storage_ptr__,(void *)0x0);
      return __return_storage_ptr__;
    }
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
    ::operator*((Reader *)local_c8,
                (IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                 *)local_68);
    uVar2 = capnp::schema::Annotation::Reader::getId((Reader *)local_c8);
    if (uVar2 == annotationId) break;
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                  *)local_68);
  }
  capnp::schema::Annotation::Reader::getValue(&local_f8,(Reader *)local_c8);
  kj::Maybe<capnp::schema::Value::Reader>::Maybe(__return_storage_ptr__,&local_f8);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<schema::Value::Reader> annotationValue(P proto, uint64_t annotationId) {
    for (auto annotation: proto.getAnnotations()) {
      if (annotation.getId() == annotationId) {
        return annotation.getValue();
      }
    }
    return nullptr;
  }